

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

void defyx::initDatasetItem(defyx_cache *cache,uint8_t *out,uint64_t itemNumber)

{
  int iVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *reciprocals;
  SuperscalarProgram *prog_00;
  int_reg_t (*r) [8];
  uint8_t *puVar2;
  uint64_t uVar3;
  uint64_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  uint q;
  SuperscalarProgram *prog;
  uint i;
  uint64_t registerValue;
  uint8_t *mixBlock;
  int_reg_t rl [8];
  uint local_7c;
  uint local_6c;
  uint64_t local_68;
  ulong local_58;
  
  local_58 = (in_RDX + 1) * 0x5851f42d4c957f2d;
  reciprocals = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (local_58 ^ 0x810a978a59f5a1fc);
  prog_00 = (SuperscalarProgram *)(local_58 ^ 0xa77099df38c2d846);
  r = (int_reg_t (*) [8])(local_58 ^ 0x8126b91cbf22495c);
  local_68 = in_RDX;
  for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
    puVar2 = getMixBlock(local_68,(uint8_t *)*in_RDI);
    executeSuperscalar(r,prog_00,reciprocals);
    for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
      uVar3 = load64_native(puVar2 + (local_7c << 3));
      (&local_58)[local_7c] = uVar3 ^ (&local_58)[local_7c];
    }
    iVar1 = SuperscalarProgram::getAddressRegister
                      ((SuperscalarProgram *)(in_RDI + (ulong)local_6c * 0x20d + 5));
    local_68 = (&local_58)[iVar1];
  }
  memcpy(in_RSI,&local_58,0x40);
  return;
}

Assistant:

void initDatasetItem(defyx_cache* cache, uint8_t* out, uint64_t itemNumber) {
		int_reg_t rl[8];
		uint8_t* mixBlock;
		uint64_t registerValue = itemNumber;
		rl[0] = (itemNumber + 1) * superscalarMul0;
		rl[1] = rl[0] ^ superscalarAdd1;
		rl[2] = rl[0] ^ superscalarAdd2;
		rl[3] = rl[0] ^ superscalarAdd3;
		rl[4] = rl[0] ^ superscalarAdd4;
		rl[5] = rl[0] ^ superscalarAdd5;
		rl[6] = rl[0] ^ superscalarAdd6;
		rl[7] = rl[0] ^ superscalarAdd7;
		for (unsigned i = 0; i < RANDOMX_CACHE_ACCESSES; ++i) {
			mixBlock = getMixBlock(registerValue, cache->memory);
			rx_prefetch_nta(mixBlock);
			SuperscalarProgram& prog = cache->programs[i];

			executeSuperscalar(rl, prog, &cache->reciprocalCache);

			for (unsigned q = 0; q < 8; ++q)
				rl[q] ^= load64_native(mixBlock + 8 * q);

			registerValue = rl[prog.getAddressRegister()];
		}

		memcpy(out, &rl, CacheLineSize);
	}